

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v7::vprint<char>
               (basic_ostream<char,_std::char_traits<char>_> *os,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args)

{
  basic_ostream<char,_std::char_traits<char>_> *in_RDX;
  buffer<char> *in_RSI;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  allocator<char> *alloc;
  locale_ref in_stack_fffffffffffffd80;
  allocator<char> local_241 [193];
  buffer<char> *in_stack_fffffffffffffe80;
  locale_ref in_stack_fffffffffffffe88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  in_stack_fffffffffffffe90;
  basic_string_view<char> in_stack_fffffffffffffea0;
  
  alloc = local_241;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80.locale_,alloc);
  std::allocator<char>::~allocator(local_241);
  detail::locale_ref::locale_ref((locale_ref *)&stack0xfffffffffffffd80);
  detail::vformat_to<char>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffea0,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  detail::write_buffer<char>(in_RDX,in_RSI);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80.locale_);
  return;
}

Assistant:

void vprint(std::basic_ostream<Char>& os, basic_string_view<Char> format_str,
            basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::write_buffer(os, buffer);
}